

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFindPathCommand.cxx
# Opt level: O2

void __thiscall
cmFindPathCommand::cmFindPathCommand(cmFindPathCommand *this,cmExecutionStatus *status)

{
  allocator<char> local_39;
  string local_38;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_38,"find_path",&local_39);
  cmFindPathCommand(this,&local_38,status);
  std::__cxx11::string::~string((string *)&local_38);
  return;
}

Assistant:

cmFindPathCommand::cmFindPathCommand(cmExecutionStatus& status)
  : cmFindPathCommand("find_path", status)
{
}